

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O1

void skiwi::compile_less_2(asmcode *code,compiler_options *ops)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  skiwi *psVar2;
  uint64_t lab;
  uint64_t lab_00;
  uint64_t lab_01;
  uint64_t lab_02;
  uint64_t lab_03;
  string error;
  string done;
  string l1;
  string l3;
  string l2;
  operand local_ec [3];
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  local_80._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,char_const(&)[9]>
            (code,(operation *)&local_80,(char (*) [9])"L_less_2");
  psVar2 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&local_80,psVar2,lab);
  psVar2 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&local_40,psVar2,lab_00);
  psVar2 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&local_60,psVar2,lab_01);
  psVar2 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&local_a0,psVar2,lab_02);
  psVar2 = label;
  paVar1 = &local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  if (ops->safe_primitives == true) {
    label = label + 1;
    label_to_string_abi_cxx11_(&local_e0,psVar2,lab_03);
    std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
  }
  local_e0._M_dataplus._M_p._0_4_ = 0x5a;
  local_ec[0] = RAX;
  local_ec[1] = 0x39;
  local_ec[2] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_e0,local_ec,local_ec + 1,(int *)(local_ec + 2));
  if (ops->safe_primitives == true) {
    local_e0._M_dataplus._M_p._0_4_ = 0x2f;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_e0,&local_80);
  }
  else {
    local_e0._M_dataplus._M_p._0_4_ = 0x38;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_e0,&local_80);
  }
  local_e0._M_dataplus._M_p._0_4_ = 0x5a;
  local_ec[0] = RBX;
  local_ec[1] = 0x39;
  local_ec[2] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_e0,local_ec,local_ec + 1,(int *)(local_ec + 2));
  if (ops->safe_primitives == true) {
    local_e0._M_dataplus._M_p._0_4_ = 0x2f;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_e0,&local_60);
  }
  else {
    local_e0._M_dataplus._M_p._0_4_ = 0x38;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_e0,&local_60);
  }
  if (ops->safe_primitives == true) {
    local_e0._M_dataplus._M_p._0_4_ = 0x4b;
    local_ec[0] = R11;
    assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
              (code,(operation *)&local_e0,local_ec);
    jump_if_arg_is_not_block(code,RAX,R11,&local_c0);
    jump_if_arg_is_not_block(code,RBX,R11,&local_c0);
  }
  local_ec[0] = AH;
  local_ec[1] = 9;
  local_ec[2] = 0x39;
  local_e0._M_dataplus._M_p = (pointer)0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_ec,local_ec + 1,local_ec + 2,(unsigned_long *)&local_e0);
  local_ec[0] = AH;
  local_ec[1] = 10;
  local_ec[2] = 0x39;
  local_e0._M_dataplus._M_p = (pointer)0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_ec,local_ec + 1,local_ec + 2,(unsigned_long *)&local_e0);
  if (ops->safe_primitives == true) {
    jump_if_arg_does_not_point_to_flonum(code,RAX,R11,&local_c0);
    jump_if_arg_does_not_point_to_flonum(code,RBX,R11,&local_c0);
    local_e0._M_dataplus._M_p._0_4_ = 0x4a;
    local_ec[0] = R11;
    assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
              (code,(operation *)&local_e0,local_ec);
  }
  local_e0._M_dataplus._M_p._0_4_ = 0x43;
  local_ec[0] = XMM0;
  local_ec[1] = 0x19;
  local_ec[2] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_e0,local_ec,local_ec + 1,(int *)(local_ec + 2));
  local_e0._M_dataplus._M_p._0_4_ = 0x43;
  local_ec[0] = XMM1;
  local_ec[1] = 0x1a;
  local_ec[2] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_e0,local_ec,local_ec + 1,(int *)(local_ec + 2));
  local_e0._M_dataplus._M_p._0_4_ = 7;
  local_ec[0] = XMM0;
  local_ec[1] = 0x44;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec,local_ec + 1);
  local_e0._M_dataplus._M_p._0_4_ = 0x42;
  local_ec[0] = RAX;
  local_ec[1] = 0x43;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec,local_ec + 1);
  local_e0._M_dataplus._M_p._0_4_ = 0x49;
  local_ec[0] = RBX;
  local_ec[1] = 0x39;
  local_ec[2] = 5;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_e0,local_ec,local_ec + 1,(int *)(local_ec + 2));
  if (ops->safe_primitives == true) {
    local_e0._M_dataplus._M_p._0_4_ = 0x2c;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_e0,&local_a0);
  }
  else {
    local_e0._M_dataplus._M_p._0_4_ = 0x35;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_e0,&local_a0);
  }
  local_e0._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_e0,&local_80);
  local_e0._M_dataplus._M_p._0_4_ = 0x5a;
  local_ec[0] = RBX;
  local_ec[1] = 0x39;
  local_ec[2] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_e0,local_ec,local_ec + 1,(int *)(local_ec + 2));
  local_e0._M_dataplus._M_p._0_4_ = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_e0,&local_40);
  fix2int(code,RAX);
  local_e0._M_dataplus._M_p._0_4_ = 0xb;
  local_ec[0] = XMM0;
  local_ec[1] = 9;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec,local_ec + 1);
  if (ops->safe_primitives == true) {
    local_e0._M_dataplus._M_p._0_4_ = 0x4b;
    local_ec[0] = R11;
    assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
              (code,(operation *)&local_e0,local_ec);
    jump_if_arg_is_not_block(code,RBX,R11,&local_c0);
  }
  local_ec[0] = AH;
  local_ec[1] = 10;
  local_ec[2] = 0x39;
  local_e0._M_dataplus._M_p = (pointer)0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_ec,local_ec + 1,local_ec + 2,(unsigned_long *)&local_e0);
  if (ops->safe_primitives == true) {
    jump_if_arg_does_not_point_to_flonum(code,RBX,R11,&local_c0);
    local_e0._M_dataplus._M_p._0_4_ = 0x4a;
    local_ec[0] = R11;
    assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
              (code,(operation *)&local_e0,local_ec);
  }
  local_e0._M_dataplus._M_p._0_4_ = 0x43;
  local_ec[0] = XMM1;
  local_ec[1] = 0x1a;
  local_ec[2] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_e0,local_ec,local_ec + 1,(int *)(local_ec + 2));
  local_e0._M_dataplus._M_p._0_4_ = 7;
  local_ec[0] = XMM0;
  local_ec[1] = 0x44;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec,local_ec + 1);
  local_e0._M_dataplus._M_p._0_4_ = 0x42;
  local_ec[0] = RAX;
  local_ec[1] = 0x43;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec,local_ec + 1);
  local_e0._M_dataplus._M_p._0_4_ = 0x49;
  local_ec[0] = RBX;
  local_ec[1] = 0x39;
  local_ec[2] = 5;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_e0,local_ec,local_ec + 1,(int *)(local_ec + 2));
  local_e0._M_dataplus._M_p._0_4_ = 0x35;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_e0,&local_a0);
  local_e0._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_e0,&local_40);
  local_e0._M_dataplus._M_p._0_4_ = 5;
  local_ec[0] = RAX;
  local_ec[1] = 10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec,local_ec + 1);
  local_e0._M_dataplus._M_p._0_4_ = 0x51;
  local_ec[0] = AL;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec);
  local_e0._M_dataplus._M_p._0_4_ = 0x44;
  local_ec[0] = RAX;
  local_ec[1] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec,local_ec + 1);
  local_e0._M_dataplus._M_p._0_4_ = 0x35;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_e0,&local_a0);
  local_e0._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_e0,&local_60);
  if (ops->safe_primitives == true) {
    local_e0._M_dataplus._M_p._0_4_ = 0x4b;
    local_ec[0] = R11;
    assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
              (code,(operation *)&local_e0,local_ec);
    jump_short_if_arg_is_not_block(code,RAX,R11,&local_c0);
  }
  local_ec[0] = AH;
  local_ec[1] = 9;
  local_ec[2] = 0x39;
  local_e0._M_dataplus._M_p = (pointer)0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_ec,local_ec + 1,local_ec + 2,(unsigned_long *)&local_e0);
  if (ops->safe_primitives == true) {
    jump_short_if_arg_does_not_point_to_flonum(code,RAX,R11,&local_c0);
    local_e0._M_dataplus._M_p._0_4_ = 0x4a;
    local_ec[0] = R11;
    assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
              (code,(operation *)&local_e0,local_ec);
  }
  local_e0._M_dataplus._M_p._0_4_ = 0x43;
  local_ec[0] = XMM0;
  local_ec[1] = 0x19;
  local_ec[2] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_e0,local_ec,local_ec + 1,(int *)(local_ec + 2));
  fix2int(code,RBX);
  local_e0._M_dataplus._M_p._0_4_ = 0xb;
  local_ec[0] = XMM1;
  local_ec[1] = 10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec,local_ec + 1);
  int2fix(code,RBX);
  local_e0._M_dataplus._M_p._0_4_ = 7;
  local_ec[0] = XMM0;
  local_ec[1] = 0x44;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec,local_ec + 1);
  local_e0._M_dataplus._M_p._0_4_ = 0x42;
  local_ec[0] = RAX;
  local_ec[1] = 0x43;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec,local_ec + 1);
  local_e0._M_dataplus._M_p._0_4_ = 0x35;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_e0,&local_a0);
  local_e0._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_e0,&local_a0);
  local_e0._M_dataplus._M_p._0_4_ = 2;
  local_ec[0] = RAX;
  local_ec[1] = 0x39;
  local_ec[2] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_e0,local_ec,local_ec + 1,(int *)(local_ec + 2));
  local_e0._M_dataplus._M_p._0_4_ = 0x55;
  local_ec[0] = RAX;
  local_ec[1] = 0x39;
  local_ec[2] = 3;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_e0,local_ec,local_ec + 1,(int *)(local_ec + 2));
  local_e0._M_dataplus._M_p._0_4_ = 0x49;
  local_ec[0] = RAX;
  local_ec[1] = 0x39;
  local_ec[2] = 7;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_e0,local_ec,local_ec + 1,(int *)(local_ec + 2));
  local_e0._M_dataplus._M_p._0_4_ = 0x4c;
  assembler::asmcode::add<assembler::asmcode::operation>(code,(operation *)&local_e0);
  if (ops->safe_primitives == true) {
    error_label(code,&local_c0,re_less_contract_violation);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                             local_c0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_80._M_dataplus._M_p._4_4_,local_80._M_dataplus._M_p._0_4_) !=
      &local_80.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_80._M_dataplus._M_p._4_4_,local_80._M_dataplus._M_p._0_4_),
                    local_80.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void compile_less_2(asmcode& code, const compiler_options& ops)
  {
  code.add(asmcode::LABEL, "L_less_2");
  auto l1 = label_to_string(label++);
  auto l2 = label_to_string(label++);
  auto l3 = label_to_string(label++);
  auto done = label_to_string(label++);
  std::string error;
  if (ops.safe_primitives)
    error = label_to_string(label++);
  code.add(asmcode::TEST, asmcode::RAX, asmcode::NUMBER, 1);
  if (ops.safe_primitives)
    code.add(asmcode::JE, l1);
  else
    code.add(asmcode::JES, l1); // rax is fixnum
  //rax is flonum
  code.add(asmcode::TEST, asmcode::RBX, asmcode::NUMBER, 1);
  if (ops.safe_primitives)
    code.add(asmcode::JE, l3); // rax is flonum and rbx is fixnum
  else
    code.add(asmcode::JES, l3); // rax is flonum and rbx is fixnum
  // rax and rbx are flonum
  // here check whether they are a block
  if (ops.safe_primitives)
    {
    code.add(asmcode::PUSH, asmcode::R11);
    jump_if_arg_is_not_block(code, asmcode::RAX, asmcode::R11, error);
    jump_if_arg_is_not_block(code, asmcode::RBX, asmcode::R11, error);
    }
  code.add(asmcode::AND, asmcode::RAX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  code.add(asmcode::AND, asmcode::RBX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  // check whether they contain flonums
  if (ops.safe_primitives)
    {
    jump_if_arg_does_not_point_to_flonum(code, asmcode::RAX, asmcode::R11, error);
    jump_if_arg_does_not_point_to_flonum(code, asmcode::RBX, asmcode::R11, error);
    code.add(asmcode::POP, asmcode::R11);
    }
  code.add(asmcode::MOVSD, asmcode::XMM0, asmcode::MEM_RAX, CELLS(1));
  code.add(asmcode::MOVSD, asmcode::XMM1, asmcode::MEM_RBX, CELLS(1));
  code.add(asmcode::CMPLTPD, asmcode::XMM0, asmcode::XMM1);
  code.add(asmcode::MOVMSKPD, asmcode::RAX, asmcode::XMM0);
  code.add(asmcode::OR, asmcode::RBX, asmcode::NUMBER, block_tag);
  if (ops.safe_primitives)
    code.add(asmcode::JMP, done);
  else
    code.add(asmcode::JMPS, done);
  code.add(asmcode::LABEL, l1);
  code.add(asmcode::TEST, asmcode::RBX, asmcode::NUMBER, 1);
  code.add(asmcode::JES, l2); // rax and rbx are fixnum
  // rax is fixnum and rbx is flonum
  fix2int(code, asmcode::RAX);
  code.add(asmcode::CVTSI2SD, asmcode::XMM0, asmcode::RAX);
  // here check whether RBX is a block
  if (ops.safe_primitives)
    {
    code.add(asmcode::PUSH, asmcode::R11);
    jump_if_arg_is_not_block(code, asmcode::RBX, asmcode::R11, error);
    }
  code.add(asmcode::AND, asmcode::RBX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  if (ops.safe_primitives)
    {
    jump_if_arg_does_not_point_to_flonum(code, asmcode::RBX, asmcode::R11, error);
    code.add(asmcode::POP, asmcode::R11);
    }
  code.add(asmcode::MOVSD, asmcode::XMM1, asmcode::MEM_RBX, CELLS(1));
  code.add(asmcode::CMPLTPD, asmcode::XMM0, asmcode::XMM1);
  code.add(asmcode::MOVMSKPD, asmcode::RAX, asmcode::XMM0);
  code.add(asmcode::OR, asmcode::RBX, asmcode::NUMBER, block_tag);
  code.add(asmcode::JMPS, done);
  code.add(asmcode::LABEL, l2);
  code.add(asmcode::CMP, asmcode::RAX, asmcode::RBX);
  code.add(asmcode::SETL, asmcode::AL);
  code.add(asmcode::MOVZX, asmcode::RAX, asmcode::AL);
  code.add(asmcode::JMPS, done);

  code.add(asmcode::LABEL, l3);
  // rax is flonum and rbx is fixnum
  // here check whether RAX is a block
  if (ops.safe_primitives)
    {
    code.add(asmcode::PUSH, asmcode::R11);
    jump_short_if_arg_is_not_block(code, asmcode::RAX, asmcode::R11, error);
    }
  code.add(asmcode::AND, asmcode::RAX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  if (ops.safe_primitives)
    {
    jump_short_if_arg_does_not_point_to_flonum(code, asmcode::RAX, asmcode::R11, error);
    code.add(asmcode::POP, asmcode::R11);
    }
  code.add(asmcode::MOVSD, asmcode::XMM0, asmcode::MEM_RAX, CELLS(1));
  fix2int(code, asmcode::RBX);
  code.add(asmcode::CVTSI2SD, asmcode::XMM1, asmcode::RBX);
  int2fix(code, asmcode::RBX);
  code.add(asmcode::CMPLTPD, asmcode::XMM0, asmcode::XMM1);
  code.add(asmcode::MOVMSKPD, asmcode::RAX, asmcode::XMM0);
  code.add(asmcode::JMPS, done);
  code.add(asmcode::LABEL, done);
  code.add(asmcode::AND, asmcode::RAX, asmcode::NUMBER, 1);
  code.add(asmcode::SHL, asmcode::RAX, asmcode::NUMBER, 3);
  code.add(asmcode::OR, asmcode::RAX, asmcode::NUMBER, bool_f);
  code.add(asmcode::RET);
  if (ops.safe_primitives)
    {
    error_label(code, error, re_less_contract_violation);
    }
  }